

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.cc
# Opt level: O0

int ixxx::linux::signalfd(int __fd,sigset_t *__mask,int __flags)

{
  int iVar1;
  signalfd_error *this;
  int *piVar2;
  int r;
  int flags_local;
  sigset_t *mask_local;
  int fd_local;
  
  iVar1 = ::signalfd(__fd,__mask,__flags);
  if (iVar1 == -1) {
    this = (signalfd_error *)__cxa_allocate_exception(0x20);
    piVar2 = __errno_location();
    signalfd_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
    __cxa_throw(this,&signalfd_error::typeinfo,signalfd_error::~signalfd_error);
  }
  return iVar1;
}

Assistant:

int signalfd(int fd, const sigset_t *mask, int flags)
    {
        int r = ::signalfd(fd, mask, flags);
        if (r == -1)
            throw signalfd_error(errno);
        return r;
    }